

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

void Saig_ManBmcSectionsTest(Aig_Man_t *p)

{
  int iVar1;
  Aig_Man_t *p_00;
  Vec_Ptr_t *pVVar2;
  uint i;
  
  p_00 = (Aig_Man_t *)Saig_ManBmcSections(p);
  iVar1 = *(int *)((long)&p_00->pName + 4);
  for (i = 0; (int)i < iVar1; i = i + 1) {
    p = p_00;
    pVVar2 = Vec_VecEntry((Vec_Vec_t *)p_00,i);
    Abc_Print((int)p,"%d=%d ",(ulong)i,(ulong)(uint)pVVar2->nSize);
  }
  Abc_Print((int)p,"\n");
  Vec_VecFree((Vec_Vec_t *)p_00);
  return;
}

Assistant:

void Saig_ManBmcSectionsTest( Aig_Man_t * p )
{
    Vec_Vec_t * vSects;
    Vec_Ptr_t * vOne;
    int i;
    vSects = Saig_ManBmcSections( p );
    Vec_VecForEachLevel( vSects, vOne, i )
        Abc_Print( 1, "%d=%d ", i, Vec_PtrSize(vOne) );
    Abc_Print( 1, "\n" );
    Vec_VecFree( vSects );
}